

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void set_stage2_params(int *min_n,int *max_n,int *step_size,int winner,int end_n)

{
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  int end_n_local;
  int winner_local;
  int *step_size_local;
  int *max_n_local;
  int *min_n_local;
  
  if (winner == 2) {
    local_24 = 3;
  }
  else {
    if (winner + -1 < 3) {
      local_28 = 2;
    }
    else {
      local_28 = winner + -1;
    }
    local_24 = local_28;
  }
  *min_n = local_24;
  if (winner == end_n) {
    local_2c = winner + -1;
  }
  else {
    if (winner + 1 < 8) {
      local_30 = winner + 1;
    }
    else {
      local_30 = 8;
    }
    local_2c = local_30;
  }
  *max_n = local_2c;
  if (*max_n - *min_n < 1) {
    local_34 = 1;
  }
  else {
    local_34 = *max_n - *min_n;
  }
  *step_size = local_34;
  return;
}

Assistant:

static inline void set_stage2_params(int *min_n, int *max_n, int *step_size,
                                     int winner, int end_n) {
  // Set min to winner - 1 unless we are already at the border, then we set it
  // to winner + 1
  *min_n = (winner == PALETTE_MIN_SIZE) ? (PALETTE_MIN_SIZE + 1)
                                        : AOMMAX(winner - 1, PALETTE_MIN_SIZE);
  // Set max to winner + 1 unless we are already at the border, then we set it
  // to winner - 1
  *max_n =
      (winner == end_n) ? (winner - 1) : AOMMIN(winner + 1, PALETTE_MAX_SIZE);

  // Set the step size to max_n - min_n so we only search those two values.
  // If max_n == min_n, then set step_size to 1 to avoid infinite loop later.
  *step_size = AOMMAX(1, *max_n - *min_n);
}